

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringClass.cpp
# Opt level: O2

bool __thiscall String::maskAgainst(String *this,String *pattern)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  String pattern_upper;
  String this_upper;
  String local_48;
  String local_28;
  
  toUppercase(&local_48,pattern);
  toUppercase(&local_28,this);
  do {
    bVar3 = true;
    if (*local_28._string._M_dataplus._M_p == '\0') {
LAB_0012d70d:
      std::__cxx11::string::~string((string *)&local_28);
      std::__cxx11::string::~string((string *)&local_48);
      return bVar3;
    }
    cVar2 = *local_48._string._M_dataplus._M_p;
    if (cVar2 == '*') {
      pcVar1 = local_48._string._M_dataplus._M_p + 1;
      if (*pcVar1 == '\0') goto LAB_0012d70d;
      local_48._string._M_dataplus._M_p = local_48._string._M_dataplus._M_p + 1;
      local_28._string._M_dataplus._M_p = local_28._string._M_dataplus._M_p + -1;
      do {
        cVar2 = local_28._string._M_dataplus._M_p[1];
        local_28._string._M_dataplus._M_p = local_28._string._M_dataplus._M_p + 1;
        if (cVar2 == *pcVar1) break;
      } while (cVar2 != '\0');
joined_r0x0012d6fa:
      if (cVar2 == '\0') {
LAB_0012d70b:
        bVar3 = false;
        goto LAB_0012d70d;
      }
    }
    else {
      if (cVar2 == '?') {
        cVar2 = local_28._string._M_dataplus._M_p[1];
        goto joined_r0x0012d6fa;
      }
      if (*local_28._string._M_dataplus._M_p != cVar2) goto LAB_0012d70b;
    }
    local_48._string._M_dataplus._M_p = local_48._string._M_dataplus._M_p + 1;
    local_28._string._M_dataplus._M_p = local_28._string._M_dataplus._M_p + 1;
  } while( true );
}

Assistant:

bool String::maskAgainst (const String& pattern) const
{
	// Elevate to uppercase for case-insensitive matching
	String pattern_upper = pattern.toUppercase();
	String this_upper = toUppercase();
	const char* maskstring = pattern_upper.c_str();
	const char* mptr = &maskstring[0];

	for (const char* sptr = this_upper.c_str(); *sptr != '\0'; sptr++)
	{
		if (*mptr == '?')
		{
			if (*(sptr + 1) == '\0')
			{
				// ? demands that there's a character here and there wasn't.
				// Therefore, mask matching fails
				return false;
			}
		}
		elif (*mptr == '*')
		{
			char end = *(++mptr);

			// If '*' is the final character of the message, all of the remaining
			// string matches against the '*'. We don't need to bother checking
			// the string any further.
			if (end == '\0')
				return true;

			// Skip to the end character
			while (*sptr != end and *sptr != '\0')
				sptr++;

			// String ended while the mask still had stuff
			if (*sptr == '\0')
				return false;
		}
		elif (*sptr != *mptr)
			return false;

		mptr++;
	}

	return true;
}